

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::GeluLayerParams::Clear(GeluLayerParams *this)

{
  this->mode_ = 0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void GeluLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.GeluLayerParams)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  mode_ = 0;
  _internal_metadata_.Clear<std::string>();
}